

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O1

void GPU_GetAnchor(GPU_Image *image,float *anchor_x,float *anchor_y)

{
  if (image != (GPU_Image *)0x0) {
    if (anchor_x != (float *)0x0) {
      *anchor_x = image->anchor_x;
    }
    if (anchor_y != (float *)0x0) {
      *anchor_y = image->anchor_y;
    }
  }
  return;
}

Assistant:

void GPU_GetAnchor(GPU_Image* image, float* anchor_x, float* anchor_y)
{
    if(image == NULL)
        return;
    
    if(anchor_x != NULL)
        *anchor_x = image->anchor_x;
    
    if(anchor_y != NULL)
        *anchor_y = image->anchor_y;
}